

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-timed.c
# Opt level: O0

_Bool player_inc_check(player *p,wchar_t idx,_Bool lore)

{
  wchar_t wVar1;
  player_state_conflict state;
  player_state_conflict state_00;
  player_state_conflict state_01;
  player_state_conflict state_02;
  player *ppVar2;
  _Bool _Var3;
  long lVar4;
  undefined8 *puVar5;
  player_state_conflict *ppVar6;
  undefined8 *puVar7;
  byte bVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined1 in_stack_fffffffffffffbc8 [312];
  monster_conflict *local_2c8;
  undefined8 local_2b8 [39];
  undefined4 local_180;
  undefined8 local_178 [39];
  undefined4 local_40;
  monster_conflict *local_38;
  monster *mon;
  timed_failure *f;
  timed_effect_data *effect;
  _Bool lore_local;
  player *ppStack_18;
  wchar_t idx_local;
  player *p_local;
  
  bVar8 = 0;
  f = (timed_failure *)(timed_effects + idx);
  mon = (monster *)timed_effects[idx].fail;
  effect._3_1_ = lore;
  effect._4_4_ = idx;
  ppStack_18 = p;
  do {
    if (mon == (monster *)0x0) {
      return true;
    }
    switch(*(undefined4 *)&mon->original_race) {
    case 1:
      if ((effect._3_1_ & 1) == 0) {
        if (cave->mon_current < L'\x01') {
          local_2c8 = (monster_conflict *)0x0;
        }
        else {
          local_2c8 = cave_monster(cave,cave->mon_current);
        }
        local_38 = local_2c8;
        equip_learn_flag(ppStack_18,*(wchar_t *)((long)&mon->original_race + 4));
        if (local_38 != (monster_conflict *)0x0) {
          update_smart_learn((monster *)local_38,ppStack_18,
                             *(wchar_t *)((long)&mon->original_race + 4),L'\0',L'\xffffffff');
        }
        _Var3 = player_of_has(ppStack_18,*(wchar_t *)((long)&mon->original_race + 4));
        if (_Var3) {
          if (local_38 != (monster_conflict *)0x0) {
            msg("You resist the effect!");
          }
          return false;
        }
      }
      else {
        _Var3 = flag_has_dbg((ppStack_18->known_state).flags,6,
                             *(int *)((long)&mon->original_race + 4),"p->known_state.flags","f->idx"
                            );
        if (_Var3) {
          return false;
        }
      }
      break;
    case 2:
      if ((*(int *)((long)&mon->original_race + 4) < 0) ||
         (0x1b < *(int *)((long)&mon->original_race + 4))) {
        __assert_fail("f->idx >= 0 && f->idx < ELEM_MAX",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-timed.c"
                      ,0x3cb,"_Bool player_inc_check(struct player *, int, _Bool)");
      }
      if ((effect._3_1_ & 1) == 0) {
        equip_learn_element(ppStack_18,*(wchar_t *)((long)&mon->original_race + 4));
        ppVar2 = ppStack_18;
        wVar1 = *(wchar_t *)((long)&mon->original_race + 4);
        ppVar6 = &ppStack_18->state;
        puVar5 = (undefined8 *)&stack0xfffffffffffffbc8;
        for (lVar4 = 0x27; lVar4 != 0; lVar4 = lVar4 + -1) {
          *puVar5 = *(undefined8 *)ppVar6->stat_add;
          ppVar6 = (player_state_conflict *)((long)ppVar6 + (ulong)bVar8 * -0x10 + 8);
          puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
        }
        state_00._312_4_ = *(undefined4 *)&(ppVar2->state).el_info[0x1b].flags;
        uVar9 = in_stack_fffffffffffffbc8._202_4_;
        uVar10 = in_stack_fffffffffffffbc8._206_4_;
        uVar11 = in_stack_fffffffffffffbc8._210_4_;
        uVar12 = in_stack_fffffffffffffbc8._214_4_;
        uVar13 = in_stack_fffffffffffffbc8._218_4_;
        uVar14 = in_stack_fffffffffffffbc8._222_4_;
        uVar15 = in_stack_fffffffffffffbc8._226_4_;
        uVar16 = in_stack_fffffffffffffbc8._230_4_;
        uVar17 = in_stack_fffffffffffffbc8._234_4_;
        uVar18 = in_stack_fffffffffffffbc8._238_4_;
        uVar19 = in_stack_fffffffffffffbc8._242_4_;
        uVar20 = in_stack_fffffffffffffbc8._246_4_;
        uVar21 = in_stack_fffffffffffffbc8._250_4_;
        uVar22 = in_stack_fffffffffffffbc8._254_4_;
        uVar23 = in_stack_fffffffffffffbc8._258_4_;
        uVar24 = in_stack_fffffffffffffbc8._262_4_;
        uVar25 = in_stack_fffffffffffffbc8._266_4_;
        uVar26 = in_stack_fffffffffffffbc8._270_4_;
        uVar27 = in_stack_fffffffffffffbc8._274_4_;
        uVar28 = in_stack_fffffffffffffbc8._278_4_;
        uVar29 = in_stack_fffffffffffffbc8._282_4_;
        uVar30 = in_stack_fffffffffffffbc8._286_4_;
        uVar31 = in_stack_fffffffffffffbc8._290_4_;
        uVar32 = in_stack_fffffffffffffbc8._294_4_;
        uVar33 = in_stack_fffffffffffffbc8._298_4_;
        uVar34 = in_stack_fffffffffffffbc8._302_4_;
        uVar35 = in_stack_fffffffffffffbc8._306_4_;
        state_00.stat_add[0] = in_stack_fffffffffffffbc8._0_4_;
        state_00.stat_add[1] = in_stack_fffffffffffffbc8._4_4_;
        state_00.stat_add[2] = in_stack_fffffffffffffbc8._8_4_;
        state_00.stat_add[3] = in_stack_fffffffffffffbc8._12_4_;
        state_00.stat_add[4] = in_stack_fffffffffffffbc8._16_4_;
        state_00.stat_ind[0] = in_stack_fffffffffffffbc8._20_4_;
        state_00.stat_ind[1] = in_stack_fffffffffffffbc8._24_4_;
        state_00.stat_ind[2] = in_stack_fffffffffffffbc8._28_4_;
        state_00.stat_ind[3] = in_stack_fffffffffffffbc8._32_4_;
        state_00.stat_ind[4] = in_stack_fffffffffffffbc8._36_4_;
        state_00.stat_use[0] = in_stack_fffffffffffffbc8._40_4_;
        state_00.stat_use[1] = in_stack_fffffffffffffbc8._44_4_;
        state_00.stat_use[2] = in_stack_fffffffffffffbc8._48_4_;
        state_00.stat_use[3] = in_stack_fffffffffffffbc8._52_4_;
        state_00.stat_use[4] = in_stack_fffffffffffffbc8._56_4_;
        state_00.stat_top[0] = in_stack_fffffffffffffbc8._60_4_;
        state_00.stat_top[1] = in_stack_fffffffffffffbc8._64_4_;
        state_00.stat_top[2] = in_stack_fffffffffffffbc8._68_4_;
        state_00.stat_top[3] = in_stack_fffffffffffffbc8._72_4_;
        state_00.stat_top[4] = in_stack_fffffffffffffbc8._76_4_;
        state_00.skills[0] = in_stack_fffffffffffffbc8._80_4_;
        state_00.skills[1] = in_stack_fffffffffffffbc8._84_4_;
        state_00.skills[2] = in_stack_fffffffffffffbc8._88_4_;
        state_00.skills[3] = in_stack_fffffffffffffbc8._92_4_;
        state_00.skills[4] = in_stack_fffffffffffffbc8._96_4_;
        state_00.skills[5] = in_stack_fffffffffffffbc8._100_4_;
        state_00.skills[6] = in_stack_fffffffffffffbc8._104_4_;
        state_00.skills[7] = in_stack_fffffffffffffbc8._108_4_;
        state_00.skills[8] = in_stack_fffffffffffffbc8._112_4_;
        state_00.skills[9] = in_stack_fffffffffffffbc8._116_4_;
        state_00.speed = in_stack_fffffffffffffbc8._120_4_;
        state_00.num_blows = in_stack_fffffffffffffbc8._124_4_;
        state_00.num_shots = in_stack_fffffffffffffbc8._128_4_;
        state_00.num_moves = in_stack_fffffffffffffbc8._132_4_;
        state_00.ammo_mult = in_stack_fffffffffffffbc8._136_4_;
        state_00.ammo_tval = in_stack_fffffffffffffbc8._140_4_;
        state_00.ac = in_stack_fffffffffffffbc8._144_4_;
        state_00.dam_red = in_stack_fffffffffffffbc8._148_4_;
        state_00.perc_dam_red = in_stack_fffffffffffffbc8._152_4_;
        state_00.to_a = in_stack_fffffffffffffbc8._156_4_;
        state_00.to_h = in_stack_fffffffffffffbc8._160_4_;
        state_00.to_d = in_stack_fffffffffffffbc8._164_4_;
        state_00.see_infra = in_stack_fffffffffffffbc8._168_4_;
        state_00.cur_light = in_stack_fffffffffffffbc8._172_4_;
        state_00.evasion_chance = in_stack_fffffffffffffbc8._176_4_;
        state_00.shield_on_back = (_Bool)in_stack_fffffffffffffbc8[0xb4];
        state_00.heavy_wield = (_Bool)in_stack_fffffffffffffbc8[0xb5];
        state_00.heavy_shoot = (_Bool)in_stack_fffffffffffffbc8[0xb6];
        state_00.bless_wield = (_Bool)in_stack_fffffffffffffbc8[0xb7];
        state_00.cumber_armor = (_Bool)in_stack_fffffffffffffbc8[0xb8];
        state_00.flags[0] = in_stack_fffffffffffffbc8[0xb9];
        state_00.flags[1] = in_stack_fffffffffffffbc8[0xba];
        state_00.flags[2] = in_stack_fffffffffffffbc8[0xbb];
        state_00.flags[3] = in_stack_fffffffffffffbc8[0xbc];
        state_00.flags[4] = in_stack_fffffffffffffbc8[0xbd];
        state_00.flags[5] = in_stack_fffffffffffffbc8[0xbe];
        state_00.pflags[0] = in_stack_fffffffffffffbc8[0xbf];
        state_00.pflags[1] = in_stack_fffffffffffffbc8[0xc0];
        state_00.pflags[2] = in_stack_fffffffffffffbc8[0xc1];
        state_00.pflags[3] = in_stack_fffffffffffffbc8[0xc2];
        state_00.pflags[4] = in_stack_fffffffffffffbc8[0xc3];
        state_00.pflags[5] = in_stack_fffffffffffffbc8[0xc4];
        state_00.pflags[6] = in_stack_fffffffffffffbc8[0xc5];
        state_00.pflags[7] = in_stack_fffffffffffffbc8[0xc6];
        state_00.pflags[8] = in_stack_fffffffffffffbc8[199];
        state_00.pflags[9] = in_stack_fffffffffffffbc8[200];
        state_00._201_1_ = in_stack_fffffffffffffbc8[0xc9];
        state_00.el_info[0].res_level = (short)uVar9;
        state_00.el_info[0].flags = (char)((uint)uVar9 >> 0x10);
        state_00.el_info[0]._3_1_ = (char)((uint)uVar9 >> 0x18);
        state_00.el_info[1].res_level = (short)uVar10;
        state_00.el_info[1].flags = (char)((uint)uVar10 >> 0x10);
        state_00.el_info[1]._3_1_ = (char)((uint)uVar10 >> 0x18);
        state_00.el_info[2].res_level = (short)uVar11;
        state_00.el_info[2].flags = (char)((uint)uVar11 >> 0x10);
        state_00.el_info[2]._3_1_ = (char)((uint)uVar11 >> 0x18);
        state_00.el_info[3].res_level = (short)uVar12;
        state_00.el_info[3].flags = (char)((uint)uVar12 >> 0x10);
        state_00.el_info[3]._3_1_ = (char)((uint)uVar12 >> 0x18);
        state_00.el_info[4].res_level = (short)uVar13;
        state_00.el_info[4].flags = (char)((uint)uVar13 >> 0x10);
        state_00.el_info[4]._3_1_ = (char)((uint)uVar13 >> 0x18);
        state_00.el_info[5].res_level = (short)uVar14;
        state_00.el_info[5].flags = (char)((uint)uVar14 >> 0x10);
        state_00.el_info[5]._3_1_ = (char)((uint)uVar14 >> 0x18);
        state_00.el_info[6].res_level = (short)uVar15;
        state_00.el_info[6].flags = (char)((uint)uVar15 >> 0x10);
        state_00.el_info[6]._3_1_ = (char)((uint)uVar15 >> 0x18);
        state_00.el_info[7].res_level = (short)uVar16;
        state_00.el_info[7].flags = (char)((uint)uVar16 >> 0x10);
        state_00.el_info[7]._3_1_ = (char)((uint)uVar16 >> 0x18);
        state_00.el_info[8].res_level = (short)uVar17;
        state_00.el_info[8].flags = (char)((uint)uVar17 >> 0x10);
        state_00.el_info[8]._3_1_ = (char)((uint)uVar17 >> 0x18);
        state_00.el_info[9].res_level = (short)uVar18;
        state_00.el_info[9].flags = (char)((uint)uVar18 >> 0x10);
        state_00.el_info[9]._3_1_ = (char)((uint)uVar18 >> 0x18);
        state_00.el_info[10].res_level = (short)uVar19;
        state_00.el_info[10].flags = (char)((uint)uVar19 >> 0x10);
        state_00.el_info[10]._3_1_ = (char)((uint)uVar19 >> 0x18);
        state_00.el_info[0xb].res_level = (short)uVar20;
        state_00.el_info[0xb].flags = (char)((uint)uVar20 >> 0x10);
        state_00.el_info[0xb]._3_1_ = (char)((uint)uVar20 >> 0x18);
        state_00.el_info[0xc].res_level = (short)uVar21;
        state_00.el_info[0xc].flags = (char)((uint)uVar21 >> 0x10);
        state_00.el_info[0xc]._3_1_ = (char)((uint)uVar21 >> 0x18);
        state_00.el_info[0xd].res_level = (short)uVar22;
        state_00.el_info[0xd].flags = (char)((uint)uVar22 >> 0x10);
        state_00.el_info[0xd]._3_1_ = (char)((uint)uVar22 >> 0x18);
        state_00.el_info[0xe].res_level = (short)uVar23;
        state_00.el_info[0xe].flags = (char)((uint)uVar23 >> 0x10);
        state_00.el_info[0xe]._3_1_ = (char)((uint)uVar23 >> 0x18);
        state_00.el_info[0xf].res_level = (short)uVar24;
        state_00.el_info[0xf].flags = (char)((uint)uVar24 >> 0x10);
        state_00.el_info[0xf]._3_1_ = (char)((uint)uVar24 >> 0x18);
        state_00.el_info[0x10].res_level = (short)uVar25;
        state_00.el_info[0x10].flags = (char)((uint)uVar25 >> 0x10);
        state_00.el_info[0x10]._3_1_ = (char)((uint)uVar25 >> 0x18);
        state_00.el_info[0x11].res_level = (short)uVar26;
        state_00.el_info[0x11].flags = (char)((uint)uVar26 >> 0x10);
        state_00.el_info[0x11]._3_1_ = (char)((uint)uVar26 >> 0x18);
        state_00.el_info[0x12].res_level = (short)uVar27;
        state_00.el_info[0x12].flags = (char)((uint)uVar27 >> 0x10);
        state_00.el_info[0x12]._3_1_ = (char)((uint)uVar27 >> 0x18);
        state_00.el_info[0x13].res_level = (short)uVar28;
        state_00.el_info[0x13].flags = (char)((uint)uVar28 >> 0x10);
        state_00.el_info[0x13]._3_1_ = (char)((uint)uVar28 >> 0x18);
        state_00.el_info[0x14].res_level = (short)uVar29;
        state_00.el_info[0x14].flags = (char)((uint)uVar29 >> 0x10);
        state_00.el_info[0x14]._3_1_ = (char)((uint)uVar29 >> 0x18);
        state_00.el_info[0x15].res_level = (short)uVar30;
        state_00.el_info[0x15].flags = (char)((uint)uVar30 >> 0x10);
        state_00.el_info[0x15]._3_1_ = (char)((uint)uVar30 >> 0x18);
        state_00.el_info[0x16].res_level = (short)uVar31;
        state_00.el_info[0x16].flags = (char)((uint)uVar31 >> 0x10);
        state_00.el_info[0x16]._3_1_ = (char)((uint)uVar31 >> 0x18);
        state_00.el_info[0x17].res_level = (short)uVar32;
        state_00.el_info[0x17].flags = (char)((uint)uVar32 >> 0x10);
        state_00.el_info[0x17]._3_1_ = (char)((uint)uVar32 >> 0x18);
        state_00.el_info[0x18].res_level = (short)uVar33;
        state_00.el_info[0x18].flags = (char)((uint)uVar33 >> 0x10);
        state_00.el_info[0x18]._3_1_ = (char)((uint)uVar33 >> 0x18);
        state_00.el_info[0x19].res_level = (short)uVar34;
        state_00.el_info[0x19].flags = (char)((uint)uVar34 >> 0x10);
        state_00.el_info[0x19]._3_1_ = (char)((uint)uVar34 >> 0x18);
        state_00.el_info[0x1a].res_level = (short)uVar35;
        state_00.el_info[0x1a].flags = (char)((uint)uVar35 >> 0x10);
        state_00.el_info[0x1a]._3_1_ = (char)((uint)uVar35 >> 0x18);
        state_00.el_info[0x1b].res_level = in_stack_fffffffffffffbc8._310_2_;
        _Var3 = player_resists_effects(state_00,wVar1);
        if (_Var3) {
          return false;
        }
      }
      else {
        wVar1 = *(wchar_t *)((long)&mon->original_race + 4);
        memcpy(local_178,&ppStack_18->known_state,0x13c);
        puVar5 = local_178;
        puVar7 = (undefined8 *)&stack0xfffffffffffffbc8;
        for (lVar4 = 0x27; lVar4 != 0; lVar4 = lVar4 + -1) {
          *puVar7 = *puVar5;
          puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
          puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
        }
        state.el_info[0x1b].flags = (undefined1)local_40;
        state.el_info[0x1b]._3_1_ = local_40._1_1_;
        state._314_2_ = local_40._2_2_;
        uVar9 = in_stack_fffffffffffffbc8._202_4_;
        uVar10 = in_stack_fffffffffffffbc8._206_4_;
        uVar11 = in_stack_fffffffffffffbc8._210_4_;
        uVar12 = in_stack_fffffffffffffbc8._214_4_;
        uVar13 = in_stack_fffffffffffffbc8._218_4_;
        uVar14 = in_stack_fffffffffffffbc8._222_4_;
        uVar15 = in_stack_fffffffffffffbc8._226_4_;
        uVar16 = in_stack_fffffffffffffbc8._230_4_;
        uVar17 = in_stack_fffffffffffffbc8._234_4_;
        uVar18 = in_stack_fffffffffffffbc8._238_4_;
        uVar19 = in_stack_fffffffffffffbc8._242_4_;
        uVar20 = in_stack_fffffffffffffbc8._246_4_;
        uVar21 = in_stack_fffffffffffffbc8._250_4_;
        uVar22 = in_stack_fffffffffffffbc8._254_4_;
        uVar23 = in_stack_fffffffffffffbc8._258_4_;
        uVar24 = in_stack_fffffffffffffbc8._262_4_;
        uVar25 = in_stack_fffffffffffffbc8._266_4_;
        uVar26 = in_stack_fffffffffffffbc8._270_4_;
        uVar27 = in_stack_fffffffffffffbc8._274_4_;
        uVar28 = in_stack_fffffffffffffbc8._278_4_;
        uVar29 = in_stack_fffffffffffffbc8._282_4_;
        uVar30 = in_stack_fffffffffffffbc8._286_4_;
        uVar31 = in_stack_fffffffffffffbc8._290_4_;
        uVar32 = in_stack_fffffffffffffbc8._294_4_;
        uVar33 = in_stack_fffffffffffffbc8._298_4_;
        uVar34 = in_stack_fffffffffffffbc8._302_4_;
        uVar35 = in_stack_fffffffffffffbc8._306_4_;
        state.stat_add[0] = in_stack_fffffffffffffbc8._0_4_;
        state.stat_add[1] = in_stack_fffffffffffffbc8._4_4_;
        state.stat_add[2] = in_stack_fffffffffffffbc8._8_4_;
        state.stat_add[3] = in_stack_fffffffffffffbc8._12_4_;
        state.stat_add[4] = in_stack_fffffffffffffbc8._16_4_;
        state.stat_ind[0] = in_stack_fffffffffffffbc8._20_4_;
        state.stat_ind[1] = in_stack_fffffffffffffbc8._24_4_;
        state.stat_ind[2] = in_stack_fffffffffffffbc8._28_4_;
        state.stat_ind[3] = in_stack_fffffffffffffbc8._32_4_;
        state.stat_ind[4] = in_stack_fffffffffffffbc8._36_4_;
        state.stat_use[0] = in_stack_fffffffffffffbc8._40_4_;
        state.stat_use[1] = in_stack_fffffffffffffbc8._44_4_;
        state.stat_use[2] = in_stack_fffffffffffffbc8._48_4_;
        state.stat_use[3] = in_stack_fffffffffffffbc8._52_4_;
        state.stat_use[4] = in_stack_fffffffffffffbc8._56_4_;
        state.stat_top[0] = in_stack_fffffffffffffbc8._60_4_;
        state.stat_top[1] = in_stack_fffffffffffffbc8._64_4_;
        state.stat_top[2] = in_stack_fffffffffffffbc8._68_4_;
        state.stat_top[3] = in_stack_fffffffffffffbc8._72_4_;
        state.stat_top[4] = in_stack_fffffffffffffbc8._76_4_;
        state.skills[0] = in_stack_fffffffffffffbc8._80_4_;
        state.skills[1] = in_stack_fffffffffffffbc8._84_4_;
        state.skills[2] = in_stack_fffffffffffffbc8._88_4_;
        state.skills[3] = in_stack_fffffffffffffbc8._92_4_;
        state.skills[4] = in_stack_fffffffffffffbc8._96_4_;
        state.skills[5] = in_stack_fffffffffffffbc8._100_4_;
        state.skills[6] = in_stack_fffffffffffffbc8._104_4_;
        state.skills[7] = in_stack_fffffffffffffbc8._108_4_;
        state.skills[8] = in_stack_fffffffffffffbc8._112_4_;
        state.skills[9] = in_stack_fffffffffffffbc8._116_4_;
        state.speed = in_stack_fffffffffffffbc8._120_4_;
        state.num_blows = in_stack_fffffffffffffbc8._124_4_;
        state.num_shots = in_stack_fffffffffffffbc8._128_4_;
        state.num_moves = in_stack_fffffffffffffbc8._132_4_;
        state.ammo_mult = in_stack_fffffffffffffbc8._136_4_;
        state.ammo_tval = in_stack_fffffffffffffbc8._140_4_;
        state.ac = in_stack_fffffffffffffbc8._144_4_;
        state.dam_red = in_stack_fffffffffffffbc8._148_4_;
        state.perc_dam_red = in_stack_fffffffffffffbc8._152_4_;
        state.to_a = in_stack_fffffffffffffbc8._156_4_;
        state.to_h = in_stack_fffffffffffffbc8._160_4_;
        state.to_d = in_stack_fffffffffffffbc8._164_4_;
        state.see_infra = in_stack_fffffffffffffbc8._168_4_;
        state.cur_light = in_stack_fffffffffffffbc8._172_4_;
        state.evasion_chance = in_stack_fffffffffffffbc8._176_4_;
        state.shield_on_back = (_Bool)in_stack_fffffffffffffbc8[0xb4];
        state.heavy_wield = (_Bool)in_stack_fffffffffffffbc8[0xb5];
        state.heavy_shoot = (_Bool)in_stack_fffffffffffffbc8[0xb6];
        state.bless_wield = (_Bool)in_stack_fffffffffffffbc8[0xb7];
        state.cumber_armor = (_Bool)in_stack_fffffffffffffbc8[0xb8];
        state.flags[0] = in_stack_fffffffffffffbc8[0xb9];
        state.flags[1] = in_stack_fffffffffffffbc8[0xba];
        state.flags[2] = in_stack_fffffffffffffbc8[0xbb];
        state.flags[3] = in_stack_fffffffffffffbc8[0xbc];
        state.flags[4] = in_stack_fffffffffffffbc8[0xbd];
        state.flags[5] = in_stack_fffffffffffffbc8[0xbe];
        state.pflags[0] = in_stack_fffffffffffffbc8[0xbf];
        state.pflags[1] = in_stack_fffffffffffffbc8[0xc0];
        state.pflags[2] = in_stack_fffffffffffffbc8[0xc1];
        state.pflags[3] = in_stack_fffffffffffffbc8[0xc2];
        state.pflags[4] = in_stack_fffffffffffffbc8[0xc3];
        state.pflags[5] = in_stack_fffffffffffffbc8[0xc4];
        state.pflags[6] = in_stack_fffffffffffffbc8[0xc5];
        state.pflags[7] = in_stack_fffffffffffffbc8[0xc6];
        state.pflags[8] = in_stack_fffffffffffffbc8[199];
        state.pflags[9] = in_stack_fffffffffffffbc8[200];
        state._201_1_ = in_stack_fffffffffffffbc8[0xc9];
        state.el_info[0].res_level = (short)uVar9;
        state.el_info[0].flags = (char)((uint)uVar9 >> 0x10);
        state.el_info[0]._3_1_ = (char)((uint)uVar9 >> 0x18);
        state.el_info[1].res_level = (short)uVar10;
        state.el_info[1].flags = (char)((uint)uVar10 >> 0x10);
        state.el_info[1]._3_1_ = (char)((uint)uVar10 >> 0x18);
        state.el_info[2].res_level = (short)uVar11;
        state.el_info[2].flags = (char)((uint)uVar11 >> 0x10);
        state.el_info[2]._3_1_ = (char)((uint)uVar11 >> 0x18);
        state.el_info[3].res_level = (short)uVar12;
        state.el_info[3].flags = (char)((uint)uVar12 >> 0x10);
        state.el_info[3]._3_1_ = (char)((uint)uVar12 >> 0x18);
        state.el_info[4].res_level = (short)uVar13;
        state.el_info[4].flags = (char)((uint)uVar13 >> 0x10);
        state.el_info[4]._3_1_ = (char)((uint)uVar13 >> 0x18);
        state.el_info[5].res_level = (short)uVar14;
        state.el_info[5].flags = (char)((uint)uVar14 >> 0x10);
        state.el_info[5]._3_1_ = (char)((uint)uVar14 >> 0x18);
        state.el_info[6].res_level = (short)uVar15;
        state.el_info[6].flags = (char)((uint)uVar15 >> 0x10);
        state.el_info[6]._3_1_ = (char)((uint)uVar15 >> 0x18);
        state.el_info[7].res_level = (short)uVar16;
        state.el_info[7].flags = (char)((uint)uVar16 >> 0x10);
        state.el_info[7]._3_1_ = (char)((uint)uVar16 >> 0x18);
        state.el_info[8].res_level = (short)uVar17;
        state.el_info[8].flags = (char)((uint)uVar17 >> 0x10);
        state.el_info[8]._3_1_ = (char)((uint)uVar17 >> 0x18);
        state.el_info[9].res_level = (short)uVar18;
        state.el_info[9].flags = (char)((uint)uVar18 >> 0x10);
        state.el_info[9]._3_1_ = (char)((uint)uVar18 >> 0x18);
        state.el_info[10].res_level = (short)uVar19;
        state.el_info[10].flags = (char)((uint)uVar19 >> 0x10);
        state.el_info[10]._3_1_ = (char)((uint)uVar19 >> 0x18);
        state.el_info[0xb].res_level = (short)uVar20;
        state.el_info[0xb].flags = (char)((uint)uVar20 >> 0x10);
        state.el_info[0xb]._3_1_ = (char)((uint)uVar20 >> 0x18);
        state.el_info[0xc].res_level = (short)uVar21;
        state.el_info[0xc].flags = (char)((uint)uVar21 >> 0x10);
        state.el_info[0xc]._3_1_ = (char)((uint)uVar21 >> 0x18);
        state.el_info[0xd].res_level = (short)uVar22;
        state.el_info[0xd].flags = (char)((uint)uVar22 >> 0x10);
        state.el_info[0xd]._3_1_ = (char)((uint)uVar22 >> 0x18);
        state.el_info[0xe].res_level = (short)uVar23;
        state.el_info[0xe].flags = (char)((uint)uVar23 >> 0x10);
        state.el_info[0xe]._3_1_ = (char)((uint)uVar23 >> 0x18);
        state.el_info[0xf].res_level = (short)uVar24;
        state.el_info[0xf].flags = (char)((uint)uVar24 >> 0x10);
        state.el_info[0xf]._3_1_ = (char)((uint)uVar24 >> 0x18);
        state.el_info[0x10].res_level = (short)uVar25;
        state.el_info[0x10].flags = (char)((uint)uVar25 >> 0x10);
        state.el_info[0x10]._3_1_ = (char)((uint)uVar25 >> 0x18);
        state.el_info[0x11].res_level = (short)uVar26;
        state.el_info[0x11].flags = (char)((uint)uVar26 >> 0x10);
        state.el_info[0x11]._3_1_ = (char)((uint)uVar26 >> 0x18);
        state.el_info[0x12].res_level = (short)uVar27;
        state.el_info[0x12].flags = (char)((uint)uVar27 >> 0x10);
        state.el_info[0x12]._3_1_ = (char)((uint)uVar27 >> 0x18);
        state.el_info[0x13].res_level = (short)uVar28;
        state.el_info[0x13].flags = (char)((uint)uVar28 >> 0x10);
        state.el_info[0x13]._3_1_ = (char)((uint)uVar28 >> 0x18);
        state.el_info[0x14].res_level = (short)uVar29;
        state.el_info[0x14].flags = (char)((uint)uVar29 >> 0x10);
        state.el_info[0x14]._3_1_ = (char)((uint)uVar29 >> 0x18);
        state.el_info[0x15].res_level = (short)uVar30;
        state.el_info[0x15].flags = (char)((uint)uVar30 >> 0x10);
        state.el_info[0x15]._3_1_ = (char)((uint)uVar30 >> 0x18);
        state.el_info[0x16].res_level = (short)uVar31;
        state.el_info[0x16].flags = (char)((uint)uVar31 >> 0x10);
        state.el_info[0x16]._3_1_ = (char)((uint)uVar31 >> 0x18);
        state.el_info[0x17].res_level = (short)uVar32;
        state.el_info[0x17].flags = (char)((uint)uVar32 >> 0x10);
        state.el_info[0x17]._3_1_ = (char)((uint)uVar32 >> 0x18);
        state.el_info[0x18].res_level = (short)uVar33;
        state.el_info[0x18].flags = (char)((uint)uVar33 >> 0x10);
        state.el_info[0x18]._3_1_ = (char)((uint)uVar33 >> 0x18);
        state.el_info[0x19].res_level = (short)uVar34;
        state.el_info[0x19].flags = (char)((uint)uVar34 >> 0x10);
        state.el_info[0x19]._3_1_ = (char)((uint)uVar34 >> 0x18);
        state.el_info[0x1a].res_level = (short)uVar35;
        state.el_info[0x1a].flags = (char)((uint)uVar35 >> 0x10);
        state.el_info[0x1a]._3_1_ = (char)((uint)uVar35 >> 0x18);
        state.el_info[0x1b].res_level = in_stack_fffffffffffffbc8._310_2_;
        _Var3 = player_resists_effects(state,wVar1);
        if (_Var3) {
          return false;
        }
      }
      break;
    case 3:
      if ((*(int *)((long)&mon->original_race + 4) < 0) ||
         (0x1b < *(int *)((long)&mon->original_race + 4))) {
        __assert_fail("f->idx >= 0 && f->idx < ELEM_MAX",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-timed.c"
                      ,0x3dd,"_Bool player_inc_check(struct player *, int, _Bool)");
      }
      if ((effect._3_1_ & 1) == 0) {
        equip_learn_element(ppStack_18,*(wchar_t *)((long)&mon->original_race + 4));
        ppVar2 = ppStack_18;
        wVar1 = *(wchar_t *)((long)&mon->original_race + 4);
        ppVar6 = &ppStack_18->state;
        puVar5 = (undefined8 *)&stack0xfffffffffffffbc8;
        for (lVar4 = 0x27; lVar4 != 0; lVar4 = lVar4 + -1) {
          *puVar5 = *(undefined8 *)ppVar6->stat_add;
          ppVar6 = (player_state_conflict *)((long)ppVar6 + (ulong)bVar8 * -0x10 + 8);
          puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
        }
        state_02._312_4_ = *(undefined4 *)&(ppVar2->state).el_info[0x1b].flags;
        uVar9 = in_stack_fffffffffffffbc8._202_4_;
        uVar10 = in_stack_fffffffffffffbc8._206_4_;
        uVar11 = in_stack_fffffffffffffbc8._210_4_;
        uVar12 = in_stack_fffffffffffffbc8._214_4_;
        uVar13 = in_stack_fffffffffffffbc8._218_4_;
        uVar14 = in_stack_fffffffffffffbc8._222_4_;
        uVar15 = in_stack_fffffffffffffbc8._226_4_;
        uVar16 = in_stack_fffffffffffffbc8._230_4_;
        uVar17 = in_stack_fffffffffffffbc8._234_4_;
        uVar18 = in_stack_fffffffffffffbc8._238_4_;
        uVar19 = in_stack_fffffffffffffbc8._242_4_;
        uVar20 = in_stack_fffffffffffffbc8._246_4_;
        uVar21 = in_stack_fffffffffffffbc8._250_4_;
        uVar22 = in_stack_fffffffffffffbc8._254_4_;
        uVar23 = in_stack_fffffffffffffbc8._258_4_;
        uVar24 = in_stack_fffffffffffffbc8._262_4_;
        uVar25 = in_stack_fffffffffffffbc8._266_4_;
        uVar26 = in_stack_fffffffffffffbc8._270_4_;
        uVar27 = in_stack_fffffffffffffbc8._274_4_;
        uVar28 = in_stack_fffffffffffffbc8._278_4_;
        uVar29 = in_stack_fffffffffffffbc8._282_4_;
        uVar30 = in_stack_fffffffffffffbc8._286_4_;
        uVar31 = in_stack_fffffffffffffbc8._290_4_;
        uVar32 = in_stack_fffffffffffffbc8._294_4_;
        uVar33 = in_stack_fffffffffffffbc8._298_4_;
        uVar34 = in_stack_fffffffffffffbc8._302_4_;
        uVar35 = in_stack_fffffffffffffbc8._306_4_;
        state_02.stat_add[0] = in_stack_fffffffffffffbc8._0_4_;
        state_02.stat_add[1] = in_stack_fffffffffffffbc8._4_4_;
        state_02.stat_add[2] = in_stack_fffffffffffffbc8._8_4_;
        state_02.stat_add[3] = in_stack_fffffffffffffbc8._12_4_;
        state_02.stat_add[4] = in_stack_fffffffffffffbc8._16_4_;
        state_02.stat_ind[0] = in_stack_fffffffffffffbc8._20_4_;
        state_02.stat_ind[1] = in_stack_fffffffffffffbc8._24_4_;
        state_02.stat_ind[2] = in_stack_fffffffffffffbc8._28_4_;
        state_02.stat_ind[3] = in_stack_fffffffffffffbc8._32_4_;
        state_02.stat_ind[4] = in_stack_fffffffffffffbc8._36_4_;
        state_02.stat_use[0] = in_stack_fffffffffffffbc8._40_4_;
        state_02.stat_use[1] = in_stack_fffffffffffffbc8._44_4_;
        state_02.stat_use[2] = in_stack_fffffffffffffbc8._48_4_;
        state_02.stat_use[3] = in_stack_fffffffffffffbc8._52_4_;
        state_02.stat_use[4] = in_stack_fffffffffffffbc8._56_4_;
        state_02.stat_top[0] = in_stack_fffffffffffffbc8._60_4_;
        state_02.stat_top[1] = in_stack_fffffffffffffbc8._64_4_;
        state_02.stat_top[2] = in_stack_fffffffffffffbc8._68_4_;
        state_02.stat_top[3] = in_stack_fffffffffffffbc8._72_4_;
        state_02.stat_top[4] = in_stack_fffffffffffffbc8._76_4_;
        state_02.skills[0] = in_stack_fffffffffffffbc8._80_4_;
        state_02.skills[1] = in_stack_fffffffffffffbc8._84_4_;
        state_02.skills[2] = in_stack_fffffffffffffbc8._88_4_;
        state_02.skills[3] = in_stack_fffffffffffffbc8._92_4_;
        state_02.skills[4] = in_stack_fffffffffffffbc8._96_4_;
        state_02.skills[5] = in_stack_fffffffffffffbc8._100_4_;
        state_02.skills[6] = in_stack_fffffffffffffbc8._104_4_;
        state_02.skills[7] = in_stack_fffffffffffffbc8._108_4_;
        state_02.skills[8] = in_stack_fffffffffffffbc8._112_4_;
        state_02.skills[9] = in_stack_fffffffffffffbc8._116_4_;
        state_02.speed = in_stack_fffffffffffffbc8._120_4_;
        state_02.num_blows = in_stack_fffffffffffffbc8._124_4_;
        state_02.num_shots = in_stack_fffffffffffffbc8._128_4_;
        state_02.num_moves = in_stack_fffffffffffffbc8._132_4_;
        state_02.ammo_mult = in_stack_fffffffffffffbc8._136_4_;
        state_02.ammo_tval = in_stack_fffffffffffffbc8._140_4_;
        state_02.ac = in_stack_fffffffffffffbc8._144_4_;
        state_02.dam_red = in_stack_fffffffffffffbc8._148_4_;
        state_02.perc_dam_red = in_stack_fffffffffffffbc8._152_4_;
        state_02.to_a = in_stack_fffffffffffffbc8._156_4_;
        state_02.to_h = in_stack_fffffffffffffbc8._160_4_;
        state_02.to_d = in_stack_fffffffffffffbc8._164_4_;
        state_02.see_infra = in_stack_fffffffffffffbc8._168_4_;
        state_02.cur_light = in_stack_fffffffffffffbc8._172_4_;
        state_02.evasion_chance = in_stack_fffffffffffffbc8._176_4_;
        state_02.shield_on_back = (_Bool)in_stack_fffffffffffffbc8[0xb4];
        state_02.heavy_wield = (_Bool)in_stack_fffffffffffffbc8[0xb5];
        state_02.heavy_shoot = (_Bool)in_stack_fffffffffffffbc8[0xb6];
        state_02.bless_wield = (_Bool)in_stack_fffffffffffffbc8[0xb7];
        state_02.cumber_armor = (_Bool)in_stack_fffffffffffffbc8[0xb8];
        state_02.flags[0] = in_stack_fffffffffffffbc8[0xb9];
        state_02.flags[1] = in_stack_fffffffffffffbc8[0xba];
        state_02.flags[2] = in_stack_fffffffffffffbc8[0xbb];
        state_02.flags[3] = in_stack_fffffffffffffbc8[0xbc];
        state_02.flags[4] = in_stack_fffffffffffffbc8[0xbd];
        state_02.flags[5] = in_stack_fffffffffffffbc8[0xbe];
        state_02.pflags[0] = in_stack_fffffffffffffbc8[0xbf];
        state_02.pflags[1] = in_stack_fffffffffffffbc8[0xc0];
        state_02.pflags[2] = in_stack_fffffffffffffbc8[0xc1];
        state_02.pflags[3] = in_stack_fffffffffffffbc8[0xc2];
        state_02.pflags[4] = in_stack_fffffffffffffbc8[0xc3];
        state_02.pflags[5] = in_stack_fffffffffffffbc8[0xc4];
        state_02.pflags[6] = in_stack_fffffffffffffbc8[0xc5];
        state_02.pflags[7] = in_stack_fffffffffffffbc8[0xc6];
        state_02.pflags[8] = in_stack_fffffffffffffbc8[199];
        state_02.pflags[9] = in_stack_fffffffffffffbc8[200];
        state_02._201_1_ = in_stack_fffffffffffffbc8[0xc9];
        state_02.el_info[0].res_level = (short)uVar9;
        state_02.el_info[0].flags = (char)((uint)uVar9 >> 0x10);
        state_02.el_info[0]._3_1_ = (char)((uint)uVar9 >> 0x18);
        state_02.el_info[1].res_level = (short)uVar10;
        state_02.el_info[1].flags = (char)((uint)uVar10 >> 0x10);
        state_02.el_info[1]._3_1_ = (char)((uint)uVar10 >> 0x18);
        state_02.el_info[2].res_level = (short)uVar11;
        state_02.el_info[2].flags = (char)((uint)uVar11 >> 0x10);
        state_02.el_info[2]._3_1_ = (char)((uint)uVar11 >> 0x18);
        state_02.el_info[3].res_level = (short)uVar12;
        state_02.el_info[3].flags = (char)((uint)uVar12 >> 0x10);
        state_02.el_info[3]._3_1_ = (char)((uint)uVar12 >> 0x18);
        state_02.el_info[4].res_level = (short)uVar13;
        state_02.el_info[4].flags = (char)((uint)uVar13 >> 0x10);
        state_02.el_info[4]._3_1_ = (char)((uint)uVar13 >> 0x18);
        state_02.el_info[5].res_level = (short)uVar14;
        state_02.el_info[5].flags = (char)((uint)uVar14 >> 0x10);
        state_02.el_info[5]._3_1_ = (char)((uint)uVar14 >> 0x18);
        state_02.el_info[6].res_level = (short)uVar15;
        state_02.el_info[6].flags = (char)((uint)uVar15 >> 0x10);
        state_02.el_info[6]._3_1_ = (char)((uint)uVar15 >> 0x18);
        state_02.el_info[7].res_level = (short)uVar16;
        state_02.el_info[7].flags = (char)((uint)uVar16 >> 0x10);
        state_02.el_info[7]._3_1_ = (char)((uint)uVar16 >> 0x18);
        state_02.el_info[8].res_level = (short)uVar17;
        state_02.el_info[8].flags = (char)((uint)uVar17 >> 0x10);
        state_02.el_info[8]._3_1_ = (char)((uint)uVar17 >> 0x18);
        state_02.el_info[9].res_level = (short)uVar18;
        state_02.el_info[9].flags = (char)((uint)uVar18 >> 0x10);
        state_02.el_info[9]._3_1_ = (char)((uint)uVar18 >> 0x18);
        state_02.el_info[10].res_level = (short)uVar19;
        state_02.el_info[10].flags = (char)((uint)uVar19 >> 0x10);
        state_02.el_info[10]._3_1_ = (char)((uint)uVar19 >> 0x18);
        state_02.el_info[0xb].res_level = (short)uVar20;
        state_02.el_info[0xb].flags = (char)((uint)uVar20 >> 0x10);
        state_02.el_info[0xb]._3_1_ = (char)((uint)uVar20 >> 0x18);
        state_02.el_info[0xc].res_level = (short)uVar21;
        state_02.el_info[0xc].flags = (char)((uint)uVar21 >> 0x10);
        state_02.el_info[0xc]._3_1_ = (char)((uint)uVar21 >> 0x18);
        state_02.el_info[0xd].res_level = (short)uVar22;
        state_02.el_info[0xd].flags = (char)((uint)uVar22 >> 0x10);
        state_02.el_info[0xd]._3_1_ = (char)((uint)uVar22 >> 0x18);
        state_02.el_info[0xe].res_level = (short)uVar23;
        state_02.el_info[0xe].flags = (char)((uint)uVar23 >> 0x10);
        state_02.el_info[0xe]._3_1_ = (char)((uint)uVar23 >> 0x18);
        state_02.el_info[0xf].res_level = (short)uVar24;
        state_02.el_info[0xf].flags = (char)((uint)uVar24 >> 0x10);
        state_02.el_info[0xf]._3_1_ = (char)((uint)uVar24 >> 0x18);
        state_02.el_info[0x10].res_level = (short)uVar25;
        state_02.el_info[0x10].flags = (char)((uint)uVar25 >> 0x10);
        state_02.el_info[0x10]._3_1_ = (char)((uint)uVar25 >> 0x18);
        state_02.el_info[0x11].res_level = (short)uVar26;
        state_02.el_info[0x11].flags = (char)((uint)uVar26 >> 0x10);
        state_02.el_info[0x11]._3_1_ = (char)((uint)uVar26 >> 0x18);
        state_02.el_info[0x12].res_level = (short)uVar27;
        state_02.el_info[0x12].flags = (char)((uint)uVar27 >> 0x10);
        state_02.el_info[0x12]._3_1_ = (char)((uint)uVar27 >> 0x18);
        state_02.el_info[0x13].res_level = (short)uVar28;
        state_02.el_info[0x13].flags = (char)((uint)uVar28 >> 0x10);
        state_02.el_info[0x13]._3_1_ = (char)((uint)uVar28 >> 0x18);
        state_02.el_info[0x14].res_level = (short)uVar29;
        state_02.el_info[0x14].flags = (char)((uint)uVar29 >> 0x10);
        state_02.el_info[0x14]._3_1_ = (char)((uint)uVar29 >> 0x18);
        state_02.el_info[0x15].res_level = (short)uVar30;
        state_02.el_info[0x15].flags = (char)((uint)uVar30 >> 0x10);
        state_02.el_info[0x15]._3_1_ = (char)((uint)uVar30 >> 0x18);
        state_02.el_info[0x16].res_level = (short)uVar31;
        state_02.el_info[0x16].flags = (char)((uint)uVar31 >> 0x10);
        state_02.el_info[0x16]._3_1_ = (char)((uint)uVar31 >> 0x18);
        state_02.el_info[0x17].res_level = (short)uVar32;
        state_02.el_info[0x17].flags = (char)((uint)uVar32 >> 0x10);
        state_02.el_info[0x17]._3_1_ = (char)((uint)uVar32 >> 0x18);
        state_02.el_info[0x18].res_level = (short)uVar33;
        state_02.el_info[0x18].flags = (char)((uint)uVar33 >> 0x10);
        state_02.el_info[0x18]._3_1_ = (char)((uint)uVar33 >> 0x18);
        state_02.el_info[0x19].res_level = (short)uVar34;
        state_02.el_info[0x19].flags = (char)((uint)uVar34 >> 0x10);
        state_02.el_info[0x19]._3_1_ = (char)((uint)uVar34 >> 0x18);
        state_02.el_info[0x1a].res_level = (short)uVar35;
        state_02.el_info[0x1a].flags = (char)((uint)uVar35 >> 0x10);
        state_02.el_info[0x1a]._3_1_ = (char)((uint)uVar35 >> 0x18);
        state_02.el_info[0x1b].res_level = in_stack_fffffffffffffbc8._310_2_;
        _Var3 = player_is_vulnerable(state_02,wVar1);
        if (_Var3) {
          return false;
        }
      }
      else {
        wVar1 = *(wchar_t *)((long)&mon->original_race + 4);
        memcpy(local_2b8,&ppStack_18->known_state,0x13c);
        puVar5 = local_2b8;
        puVar7 = (undefined8 *)&stack0xfffffffffffffbc8;
        for (lVar4 = 0x27; lVar4 != 0; lVar4 = lVar4 + -1) {
          *puVar7 = *puVar5;
          puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
          puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
        }
        state_01.el_info[0x1b].flags = (undefined1)local_180;
        state_01.el_info[0x1b]._3_1_ = local_180._1_1_;
        state_01._314_2_ = local_180._2_2_;
        uVar9 = in_stack_fffffffffffffbc8._202_4_;
        uVar10 = in_stack_fffffffffffffbc8._206_4_;
        uVar11 = in_stack_fffffffffffffbc8._210_4_;
        uVar12 = in_stack_fffffffffffffbc8._214_4_;
        uVar13 = in_stack_fffffffffffffbc8._218_4_;
        uVar14 = in_stack_fffffffffffffbc8._222_4_;
        uVar15 = in_stack_fffffffffffffbc8._226_4_;
        uVar16 = in_stack_fffffffffffffbc8._230_4_;
        uVar17 = in_stack_fffffffffffffbc8._234_4_;
        uVar18 = in_stack_fffffffffffffbc8._238_4_;
        uVar19 = in_stack_fffffffffffffbc8._242_4_;
        uVar20 = in_stack_fffffffffffffbc8._246_4_;
        uVar21 = in_stack_fffffffffffffbc8._250_4_;
        uVar22 = in_stack_fffffffffffffbc8._254_4_;
        uVar23 = in_stack_fffffffffffffbc8._258_4_;
        uVar24 = in_stack_fffffffffffffbc8._262_4_;
        uVar25 = in_stack_fffffffffffffbc8._266_4_;
        uVar26 = in_stack_fffffffffffffbc8._270_4_;
        uVar27 = in_stack_fffffffffffffbc8._274_4_;
        uVar28 = in_stack_fffffffffffffbc8._278_4_;
        uVar29 = in_stack_fffffffffffffbc8._282_4_;
        uVar30 = in_stack_fffffffffffffbc8._286_4_;
        uVar31 = in_stack_fffffffffffffbc8._290_4_;
        uVar32 = in_stack_fffffffffffffbc8._294_4_;
        uVar33 = in_stack_fffffffffffffbc8._298_4_;
        uVar34 = in_stack_fffffffffffffbc8._302_4_;
        uVar35 = in_stack_fffffffffffffbc8._306_4_;
        state_01.stat_add[0] = in_stack_fffffffffffffbc8._0_4_;
        state_01.stat_add[1] = in_stack_fffffffffffffbc8._4_4_;
        state_01.stat_add[2] = in_stack_fffffffffffffbc8._8_4_;
        state_01.stat_add[3] = in_stack_fffffffffffffbc8._12_4_;
        state_01.stat_add[4] = in_stack_fffffffffffffbc8._16_4_;
        state_01.stat_ind[0] = in_stack_fffffffffffffbc8._20_4_;
        state_01.stat_ind[1] = in_stack_fffffffffffffbc8._24_4_;
        state_01.stat_ind[2] = in_stack_fffffffffffffbc8._28_4_;
        state_01.stat_ind[3] = in_stack_fffffffffffffbc8._32_4_;
        state_01.stat_ind[4] = in_stack_fffffffffffffbc8._36_4_;
        state_01.stat_use[0] = in_stack_fffffffffffffbc8._40_4_;
        state_01.stat_use[1] = in_stack_fffffffffffffbc8._44_4_;
        state_01.stat_use[2] = in_stack_fffffffffffffbc8._48_4_;
        state_01.stat_use[3] = in_stack_fffffffffffffbc8._52_4_;
        state_01.stat_use[4] = in_stack_fffffffffffffbc8._56_4_;
        state_01.stat_top[0] = in_stack_fffffffffffffbc8._60_4_;
        state_01.stat_top[1] = in_stack_fffffffffffffbc8._64_4_;
        state_01.stat_top[2] = in_stack_fffffffffffffbc8._68_4_;
        state_01.stat_top[3] = in_stack_fffffffffffffbc8._72_4_;
        state_01.stat_top[4] = in_stack_fffffffffffffbc8._76_4_;
        state_01.skills[0] = in_stack_fffffffffffffbc8._80_4_;
        state_01.skills[1] = in_stack_fffffffffffffbc8._84_4_;
        state_01.skills[2] = in_stack_fffffffffffffbc8._88_4_;
        state_01.skills[3] = in_stack_fffffffffffffbc8._92_4_;
        state_01.skills[4] = in_stack_fffffffffffffbc8._96_4_;
        state_01.skills[5] = in_stack_fffffffffffffbc8._100_4_;
        state_01.skills[6] = in_stack_fffffffffffffbc8._104_4_;
        state_01.skills[7] = in_stack_fffffffffffffbc8._108_4_;
        state_01.skills[8] = in_stack_fffffffffffffbc8._112_4_;
        state_01.skills[9] = in_stack_fffffffffffffbc8._116_4_;
        state_01.speed = in_stack_fffffffffffffbc8._120_4_;
        state_01.num_blows = in_stack_fffffffffffffbc8._124_4_;
        state_01.num_shots = in_stack_fffffffffffffbc8._128_4_;
        state_01.num_moves = in_stack_fffffffffffffbc8._132_4_;
        state_01.ammo_mult = in_stack_fffffffffffffbc8._136_4_;
        state_01.ammo_tval = in_stack_fffffffffffffbc8._140_4_;
        state_01.ac = in_stack_fffffffffffffbc8._144_4_;
        state_01.dam_red = in_stack_fffffffffffffbc8._148_4_;
        state_01.perc_dam_red = in_stack_fffffffffffffbc8._152_4_;
        state_01.to_a = in_stack_fffffffffffffbc8._156_4_;
        state_01.to_h = in_stack_fffffffffffffbc8._160_4_;
        state_01.to_d = in_stack_fffffffffffffbc8._164_4_;
        state_01.see_infra = in_stack_fffffffffffffbc8._168_4_;
        state_01.cur_light = in_stack_fffffffffffffbc8._172_4_;
        state_01.evasion_chance = in_stack_fffffffffffffbc8._176_4_;
        state_01.shield_on_back = (_Bool)in_stack_fffffffffffffbc8[0xb4];
        state_01.heavy_wield = (_Bool)in_stack_fffffffffffffbc8[0xb5];
        state_01.heavy_shoot = (_Bool)in_stack_fffffffffffffbc8[0xb6];
        state_01.bless_wield = (_Bool)in_stack_fffffffffffffbc8[0xb7];
        state_01.cumber_armor = (_Bool)in_stack_fffffffffffffbc8[0xb8];
        state_01.flags[0] = in_stack_fffffffffffffbc8[0xb9];
        state_01.flags[1] = in_stack_fffffffffffffbc8[0xba];
        state_01.flags[2] = in_stack_fffffffffffffbc8[0xbb];
        state_01.flags[3] = in_stack_fffffffffffffbc8[0xbc];
        state_01.flags[4] = in_stack_fffffffffffffbc8[0xbd];
        state_01.flags[5] = in_stack_fffffffffffffbc8[0xbe];
        state_01.pflags[0] = in_stack_fffffffffffffbc8[0xbf];
        state_01.pflags[1] = in_stack_fffffffffffffbc8[0xc0];
        state_01.pflags[2] = in_stack_fffffffffffffbc8[0xc1];
        state_01.pflags[3] = in_stack_fffffffffffffbc8[0xc2];
        state_01.pflags[4] = in_stack_fffffffffffffbc8[0xc3];
        state_01.pflags[5] = in_stack_fffffffffffffbc8[0xc4];
        state_01.pflags[6] = in_stack_fffffffffffffbc8[0xc5];
        state_01.pflags[7] = in_stack_fffffffffffffbc8[0xc6];
        state_01.pflags[8] = in_stack_fffffffffffffbc8[199];
        state_01.pflags[9] = in_stack_fffffffffffffbc8[200];
        state_01._201_1_ = in_stack_fffffffffffffbc8[0xc9];
        state_01.el_info[0].res_level = (short)uVar9;
        state_01.el_info[0].flags = (char)((uint)uVar9 >> 0x10);
        state_01.el_info[0]._3_1_ = (char)((uint)uVar9 >> 0x18);
        state_01.el_info[1].res_level = (short)uVar10;
        state_01.el_info[1].flags = (char)((uint)uVar10 >> 0x10);
        state_01.el_info[1]._3_1_ = (char)((uint)uVar10 >> 0x18);
        state_01.el_info[2].res_level = (short)uVar11;
        state_01.el_info[2].flags = (char)((uint)uVar11 >> 0x10);
        state_01.el_info[2]._3_1_ = (char)((uint)uVar11 >> 0x18);
        state_01.el_info[3].res_level = (short)uVar12;
        state_01.el_info[3].flags = (char)((uint)uVar12 >> 0x10);
        state_01.el_info[3]._3_1_ = (char)((uint)uVar12 >> 0x18);
        state_01.el_info[4].res_level = (short)uVar13;
        state_01.el_info[4].flags = (char)((uint)uVar13 >> 0x10);
        state_01.el_info[4]._3_1_ = (char)((uint)uVar13 >> 0x18);
        state_01.el_info[5].res_level = (short)uVar14;
        state_01.el_info[5].flags = (char)((uint)uVar14 >> 0x10);
        state_01.el_info[5]._3_1_ = (char)((uint)uVar14 >> 0x18);
        state_01.el_info[6].res_level = (short)uVar15;
        state_01.el_info[6].flags = (char)((uint)uVar15 >> 0x10);
        state_01.el_info[6]._3_1_ = (char)((uint)uVar15 >> 0x18);
        state_01.el_info[7].res_level = (short)uVar16;
        state_01.el_info[7].flags = (char)((uint)uVar16 >> 0x10);
        state_01.el_info[7]._3_1_ = (char)((uint)uVar16 >> 0x18);
        state_01.el_info[8].res_level = (short)uVar17;
        state_01.el_info[8].flags = (char)((uint)uVar17 >> 0x10);
        state_01.el_info[8]._3_1_ = (char)((uint)uVar17 >> 0x18);
        state_01.el_info[9].res_level = (short)uVar18;
        state_01.el_info[9].flags = (char)((uint)uVar18 >> 0x10);
        state_01.el_info[9]._3_1_ = (char)((uint)uVar18 >> 0x18);
        state_01.el_info[10].res_level = (short)uVar19;
        state_01.el_info[10].flags = (char)((uint)uVar19 >> 0x10);
        state_01.el_info[10]._3_1_ = (char)((uint)uVar19 >> 0x18);
        state_01.el_info[0xb].res_level = (short)uVar20;
        state_01.el_info[0xb].flags = (char)((uint)uVar20 >> 0x10);
        state_01.el_info[0xb]._3_1_ = (char)((uint)uVar20 >> 0x18);
        state_01.el_info[0xc].res_level = (short)uVar21;
        state_01.el_info[0xc].flags = (char)((uint)uVar21 >> 0x10);
        state_01.el_info[0xc]._3_1_ = (char)((uint)uVar21 >> 0x18);
        state_01.el_info[0xd].res_level = (short)uVar22;
        state_01.el_info[0xd].flags = (char)((uint)uVar22 >> 0x10);
        state_01.el_info[0xd]._3_1_ = (char)((uint)uVar22 >> 0x18);
        state_01.el_info[0xe].res_level = (short)uVar23;
        state_01.el_info[0xe].flags = (char)((uint)uVar23 >> 0x10);
        state_01.el_info[0xe]._3_1_ = (char)((uint)uVar23 >> 0x18);
        state_01.el_info[0xf].res_level = (short)uVar24;
        state_01.el_info[0xf].flags = (char)((uint)uVar24 >> 0x10);
        state_01.el_info[0xf]._3_1_ = (char)((uint)uVar24 >> 0x18);
        state_01.el_info[0x10].res_level = (short)uVar25;
        state_01.el_info[0x10].flags = (char)((uint)uVar25 >> 0x10);
        state_01.el_info[0x10]._3_1_ = (char)((uint)uVar25 >> 0x18);
        state_01.el_info[0x11].res_level = (short)uVar26;
        state_01.el_info[0x11].flags = (char)((uint)uVar26 >> 0x10);
        state_01.el_info[0x11]._3_1_ = (char)((uint)uVar26 >> 0x18);
        state_01.el_info[0x12].res_level = (short)uVar27;
        state_01.el_info[0x12].flags = (char)((uint)uVar27 >> 0x10);
        state_01.el_info[0x12]._3_1_ = (char)((uint)uVar27 >> 0x18);
        state_01.el_info[0x13].res_level = (short)uVar28;
        state_01.el_info[0x13].flags = (char)((uint)uVar28 >> 0x10);
        state_01.el_info[0x13]._3_1_ = (char)((uint)uVar28 >> 0x18);
        state_01.el_info[0x14].res_level = (short)uVar29;
        state_01.el_info[0x14].flags = (char)((uint)uVar29 >> 0x10);
        state_01.el_info[0x14]._3_1_ = (char)((uint)uVar29 >> 0x18);
        state_01.el_info[0x15].res_level = (short)uVar30;
        state_01.el_info[0x15].flags = (char)((uint)uVar30 >> 0x10);
        state_01.el_info[0x15]._3_1_ = (char)((uint)uVar30 >> 0x18);
        state_01.el_info[0x16].res_level = (short)uVar31;
        state_01.el_info[0x16].flags = (char)((uint)uVar31 >> 0x10);
        state_01.el_info[0x16]._3_1_ = (char)((uint)uVar31 >> 0x18);
        state_01.el_info[0x17].res_level = (short)uVar32;
        state_01.el_info[0x17].flags = (char)((uint)uVar32 >> 0x10);
        state_01.el_info[0x17]._3_1_ = (char)((uint)uVar32 >> 0x18);
        state_01.el_info[0x18].res_level = (short)uVar33;
        state_01.el_info[0x18].flags = (char)((uint)uVar33 >> 0x10);
        state_01.el_info[0x18]._3_1_ = (char)((uint)uVar33 >> 0x18);
        state_01.el_info[0x19].res_level = (short)uVar34;
        state_01.el_info[0x19].flags = (char)((uint)uVar34 >> 0x10);
        state_01.el_info[0x19]._3_1_ = (char)((uint)uVar34 >> 0x18);
        state_01.el_info[0x1a].res_level = (short)uVar35;
        state_01.el_info[0x1a].flags = (char)((uint)uVar35 >> 0x10);
        state_01.el_info[0x1a]._3_1_ = (char)((uint)uVar35 >> 0x18);
        state_01.el_info[0x1b].res_level = in_stack_fffffffffffffbc8._310_2_;
        _Var3 = player_is_vulnerable(state_01,wVar1);
        if (_Var3) {
          return false;
        }
      }
      break;
    case 4:
      if ((effect._3_1_ & 1) == 0) {
        _Var3 = flag_has_dbg((ppStack_18->state).pflags,10,*(int *)((long)&mon->original_race + 4),
                             "p->state.pflags","(f->idx)");
        if (_Var3) {
          return false;
        }
      }
      else {
        _Var3 = flag_has_dbg((ppStack_18->known_state).pflags,10,
                             *(int *)((long)&mon->original_race + 4),"p->known_state.pflags",
                             "f->idx");
        if (_Var3) {
          return false;
        }
      }
      break;
    case 5:
      if ((*(int *)((long)&mon->original_race + 4) < 0) ||
         (0x34 < *(int *)((long)&mon->original_race + 4))) {
        __assert_fail("f->idx >= 0 && f->idx < TMD_MAX",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-timed.c"
                      ,0x3fe,"_Bool player_inc_check(struct player *, int, _Bool)");
      }
      if (ppStack_18->timed[*(int *)((long)&mon->original_race + 4)] != 0) {
        return false;
      }
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-timed.c"
                    ,0x406,"_Bool player_inc_check(struct player *, int, _Bool)");
    }
    mon = (monster *)mon->race;
  } while( true );
}

Assistant:

bool player_inc_check(struct player *p, int idx, bool lore)
{
	struct timed_effect_data *effect = &timed_effects[idx];
	struct timed_failure *f = effect->fail;

	while (f) {
		switch (f->code) {
		case TMD_FAIL_FLAG_OBJECT:
			/* Effect is inhibited by an object flag */
			if (lore) {
				if (of_has(p->known_state.flags, f->idx)) {
					return false;
				}
			} else {
				/*
				 * If the effect is from a monster action,
				 * extra stuff happens.
				 */
				struct monster *mon = cave->mon_current > 0 ?
					cave_monster(cave, cave->mon_current) :
					NULL;

				equip_learn_flag(p, f->idx);
				if (mon) {
					update_smart_learn(mon, p, f->idx,
						0, -1);
				}
				if (player_of_has(p, f->idx)) {
					if (mon) {
						msg("You resist the effect!");
					}
					return false;
				}
			}
			break;

		case TMD_FAIL_FLAG_RESIST:
			/* Effect is inhibited by a resist */
			assert(f->idx >= 0 && f->idx < ELEM_MAX);
			if (lore) {
				if (player_resists_effects(p->known_state, f->idx)) {
					return false;
				}
			} else {
				equip_learn_element(p, f->idx);
				if (player_resists_effects(p->state, f->idx)) {
					return false;
				}
			}
			break;

		case TMD_FAIL_FLAG_VULN:
			/*
			 * Effect is inhibited by a vulnerability
			 * the asymmetry with resists is OK for now - NRM
			 */
			assert(f->idx >= 0 && f->idx < ELEM_MAX);
			if (lore) {
				if (player_is_vulnerable(p->known_state, f->idx)) {
					return false;
				}
			} else {
				equip_learn_element(p, f->idx);
				if (player_is_vulnerable(p->state, f->idx)) {
					return false;
				}
			}
			break;

		case TMD_FAIL_FLAG_PLAYER:
			/* Effect is inhibited by a player flag */
			if (lore) {
				if (pf_has(p->known_state.pflags, f->idx)) {
					return false;
				}
			} else {
				if (player_has(p, f->idx)) {
					return false;
				}
			}
			break;

		case TMD_FAIL_FLAG_TIMED_EFFECT:
			/*
			 * Effect is inhibited by a timed effect.  If timed
			 * effect is active, it is known to the player, so
			 * there's no difference between whether this is
			 * solely a lore check or not.
			 */
			assert(f->idx >= 0 && f->idx < TMD_MAX);
			if (p->timed[f->idx]) {
				return false;
			}
			break;

		default:
			/* Should never happen. */
			assert(0);
			break;
		}

		f = f->next;
	}

	/* Nothing prevents this effect from incrementing. */
	return true;
}